

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

void __thiscall smf::MidiFile::setFilename(MidiFile *this,string *aname)

{
  string local_40 [32];
  long local_20;
  size_type loc;
  string *aname_local;
  MidiFile *this_local;
  
  loc = (size_type)aname;
  aname_local = (string *)this;
  local_20 = std::__cxx11::string::rfind((char)aname,0x2f);
  if (local_20 == -1) {
    std::__cxx11::string::operator=((string *)&this->m_readFileName,(string *)loc);
  }
  else {
    std::__cxx11::string::substr((ulong)local_40,loc);
    std::__cxx11::string::operator=((string *)&this->m_readFileName,local_40);
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void MidiFile::setFilename(const std::string& aname) {
	auto loc = aname.rfind('/');
	if (loc != std::string::npos) {
		m_readFileName = aname.substr(loc+1);
	} else {
		m_readFileName = aname;
	}
}